

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
userDefinedUnits_definitions_Test::~userDefinedUnits_definitions_Test
          (userDefinedUnits_definitions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(userDefinedUnits, definitions)
{
    precise_unit clucks(19.3, precise::m * precise::A);
    precise_unit sclucks(23, precise::m * precise::mol * precise::currency);
    addUserDefinedUnit("clucks", clucks);
    addUserDefinedUnit("sclucks", sclucks);

    EXPECT_EQ(unit_from_string("clucks/A"), precise_unit(19.3, precise::m));

    EXPECT_EQ(
        unit_from_string("sclucks/$"),
        precise_unit(23, precise::m * precise::mol));

    EXPECT_EQ(to_string(clucks), "clucks");

    EXPECT_EQ(to_string(clucks.inv()), "1/clucks");

    EXPECT_EQ(to_string(clucks.pow(2)), "clucks^2");

    EXPECT_EQ(to_string(clucks * kg), "clucks*kg");

    EXPECT_EQ(to_string(clucks * V), "clucks*V");

    EXPECT_EQ(to_string(clucks * mol), "clucks*mol");

    EXPECT_EQ(to_string(clucks * hp), "hp*clucks");

    EXPECT_EQ(to_string(clucks.pow(2) * kg), "kg*clucks^2");

    EXPECT_EQ(to_string(clucks.pow(3) * kg), "kg*clucks^3");

    EXPECT_EQ(to_string(precise::kg / clucks), "kg/clucks");

    EXPECT_EQ(to_string(precise::kg / clucks.pow(2)), "kg/clucks^2");

    EXPECT_EQ(to_string(precise::kg / clucks.pow(3)), "kg/clucks^3");

    EXPECT_EQ(
        to_string(precise::micro * precise::g / sclucks.pow(3)),
        "ug/sclucks^3");

    EXPECT_EQ(
        to_string(precise_unit(17, precise::kg) / sclucks), "17kg/sclucks");

    EXPECT_EQ(
        to_string(precise_unit(17, precise::kg) / sclucks.pow(2)),
        "17kg/sclucks^2");

    EXPECT_EQ(
        to_string(precise_unit(17, precise::kg) / sclucks.pow(3)),
        "17kg/sclucks^3");

    clearUserDefinedUnits();
}